

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_queue.c
# Opt level: O0

void ngx_queue_sort(ngx_queue_t *queue,_func_ngx_int_t_ngx_queue_t_ptr_ngx_queue_t_ptr *cmp)

{
  ngx_queue_t *pnVar1;
  ngx_int_t nVar2;
  ngx_queue_t *next;
  ngx_queue_t *prev;
  ngx_queue_t *q;
  _func_ngx_int_t_ngx_queue_t_ptr_ngx_queue_t_ptr *cmp_local;
  ngx_queue_t *queue_local;
  
  if (queue->next != queue->prev) {
    prev = queue->next->next;
    while (prev != queue) {
      next = prev->prev;
      pnVar1 = prev->next;
      prev->next->prev = prev->prev;
      prev->prev->next = prev->next;
      prev->prev = (ngx_queue_t *)0x0;
      prev->next = (ngx_queue_t *)0x0;
      do {
        nVar2 = (*cmp)(next,prev);
        if (nVar2 < 1) break;
        next = next->prev;
      } while (next != queue);
      prev->next = next->next;
      prev->next->prev = prev;
      prev->prev = next;
      next->next = prev;
      prev = pnVar1;
    }
  }
  return;
}

Assistant:

void
ngx_queue_sort(ngx_queue_t *queue,
    ngx_int_t (*cmp)(const ngx_queue_t *, const ngx_queue_t *))
{
    ngx_queue_t  *q, *prev, *next;

    q = ngx_queue_head(queue);

    if (q == ngx_queue_last(queue)) {
        return;
    }

    for (q = ngx_queue_next(q); q != ngx_queue_sentinel(queue); q = next) {

        prev = ngx_queue_prev(q);
        next = ngx_queue_next(q);

        ngx_queue_remove(q);

        do {
            if (cmp(prev, q) <= 0) {
                break;
            }

            prev = ngx_queue_prev(prev);

        } while (prev != ngx_queue_sentinel(queue));

        ngx_queue_insert_after(prev, q);
    }
}